

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O2

bool __thiscall
despot::SimpleRockSample::Step
          (SimpleRockSample *this,State *state,double rand_num,ACT_TYPE action,double *reward,
          OBS_TYPE *obs)

{
  int iVar1;
  int iVar2;
  
  iVar1 = *(int *)(state + 0x20);
  if (iVar1 == 1) {
    if (action == 3) {
      *reward = 0.0;
      iVar1 = 1;
      iVar2 = 1 - *(int *)(state + 0x24);
      if (0.2 < rand_num) {
        iVar2 = *(int *)(state + 0x24);
      }
      *obs = (long)iVar2;
      goto LAB_001066f3;
    }
    if (action != 2) {
      if (action == 0) goto LAB_00106662;
      *reward = 10.0;
      *obs = 1;
      *(undefined4 *)(state + 0x20) = 2;
      iVar1 = 2;
      goto LAB_001066f3;
    }
    *reward = 0.0;
    *obs = 1;
    *(undefined4 *)(state + 0x20) = 0;
  }
  else {
    if (iVar1 != 0) goto LAB_001066f3;
    if (action == 3) {
      *reward = 0.0;
      *obs = (ulong)(*(int *)(state + 0x24) == 1);
    }
    else {
      if (action == 2) {
LAB_00106662:
        *reward = -100.0;
        *obs = 1;
        return true;
      }
      if (action != 0) {
        *reward = 0.0;
        *obs = 1;
        *(undefined4 *)(state + 0x20) = 1;
        iVar1 = 1;
        goto LAB_001066f3;
      }
      iVar1 = -10;
      if (*(int *)(state + 0x24) == 1) {
        iVar1 = 10;
      }
      *reward = (double)iVar1;
      *obs = 1;
      *(undefined4 *)(state + 0x24) = 0;
    }
  }
  iVar1 = 0;
LAB_001066f3:
  return iVar1 == 2;
}

Assistant:

bool SimpleRockSample::Step(State& state, double rand_num, ACT_TYPE action,
        double& reward, OBS_TYPE& obs) const {
    SimpleState& simple_state = static_cast < SimpleState& >(state);
    int& rover_position = simple_state.rover_position;
    int& rock_status = simple_state.rock_status;
 
    if (rover_position == LEFT) {
        if (action == A_SAMPLE) {
            reward = (rock_status == R_GOOD) ? 10 : -10;
            obs = O_GOOD;
            rock_status = R_BAD;
        } else if (action == A_CHECK) {
            reward = 0;
            // when the rover at LEFT, its observation is correct with probability 1
            obs = (rock_status == R_GOOD) ? O_GOOD : O_BAD;  
        } else if (action == A_WEST) {
            reward = -100;
            // moving does not incur observation, setting a default observation 
            // note that we can also set the default observation to O_BAD, as long
            // as it is consistent.
            obs = O_GOOD;
            return true; // Moving off the grid terminates the task. 
        } else { // moving EAST
            reward = 0;
            // moving does not incur observation, setting a default observation
            obs = O_GOOD;
            rover_position = MIDDLE;
        }
    } else if (rover_position  == MIDDLE) {
        if (action == A_SAMPLE) {
            reward = -100;
            // moving does not incur observation, setting a default observation 
            obs = O_GOOD;
            return true; // sampling in the grid where there is no rock terminates the task
        } else if (action == A_CHECK) {
            reward = 0;
            // when the rover is at MIDDLE, its observation is correct with probability 0.8
            obs =  (rand_num > 0.20) ? rock_status : (1 - rock_status);
        } else if (action == A_WEST) {
            reward = 0;
            // moving does not incur observation, setting a default observation 
            obs = O_GOOD;
            rover_position = LEFT;
        } else { //moving EAST to exit
            reward = 10;
            obs = O_GOOD;
            rover_position = RIGHT;
        }
    }

 	if(rover_position == RIGHT) return true;
 	else return false;
}